

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void do_xsave_sse(CPUX86State *env,target_ulong ptr,uintptr_t ra)

{
  target_ulong ptr_00;
  byte bVar1;
  long lVar2;
  
  bVar1 = *(byte *)((long)&env->hflags + 1);
  for (lVar2 = 0; (ulong)(bVar1 & 0xffffff80) + 0x80 != lVar2; lVar2 = lVar2 + 0x10) {
    ptr_00 = ptr + 0xa0 + lVar2;
    cpu_stq_data_ra_x86_64(env,ptr_00,*(uint64_t *)((long)env->xmm_regs + lVar2 * 4),ra);
    cpu_stq_data_ra_x86_64(env,ptr_00 + 8,*(uint64_t *)((long)env->xmm_regs + lVar2 * 4 + 8),ra);
  }
  return;
}

Assistant:

static void do_xsave_sse(CPUX86State *env, target_ulong ptr, uintptr_t ra)
{
    int i, nb_xmm_regs;
    target_ulong addr;

    if (env->hflags & HF_CS64_MASK) {
        nb_xmm_regs = 16;
    } else {
        nb_xmm_regs = 8;
    }

    addr = ptr + XO(legacy.xmm_regs);
    for (i = 0; i < nb_xmm_regs; i++) {
        cpu_stq_data_ra(env, addr, env->xmm_regs[i].ZMM_Q(0), ra);
        cpu_stq_data_ra(env, addr + 8, env->xmm_regs[i].ZMM_Q(1), ra);
        addr += 16;
    }
}